

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

void HandleError(Status *status)

{
  long lVar1;
  runtime_error *this;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  string local_58;
  string errmsg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (status->state_ == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    leveldb::Status::ToString_abi_cxx11_(&local_58,status);
    std::operator+(&errmsg,"Fatal LevelDB error: ",&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    logging_function._M_str = "HandleError";
    logging_function._M_len = 0xb;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file._M_len = 0x5d;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x31,ALL,Info,(ConstevalFormatString<1U>)0x86d2a1,
               &errmsg);
    logging_function_00._M_str = "HandleError";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_00._M_len = 0x5d;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x32,ALL,Info,(ConstevalFormatString<0U>)0x816509)
    ;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,(string *)&errmsg);
    *(undefined ***)this = &PTR__runtime_error_00afe9e0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&dbwrapper_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void HandleError(const leveldb::Status& status)
{
    if (status.ok())
        return;
    const std::string errmsg = "Fatal LevelDB error: " + status.ToString();
    LogPrintf("%s\n", errmsg);
    LogPrintf("You can use -debug=leveldb to get more complete diagnostic messages\n");
    throw dbwrapper_error(errmsg);
}